

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Privkey_Mainnet_Uncompress_Test::TestBody
          (Descriptor_Parse_Privkey_Mainnet_Uncompress_Test *this)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_4;
  CfdException *except_1;
  AssertHelper local_e38;
  Message local_e30;
  bool local_e21;
  undefined1 local_e20 [8];
  AssertionResult gtest_ar__1;
  string local_ca0;
  AssertHelper local_c80;
  Message local_c78;
  bool local_c69;
  undefined1 local_c68 [8];
  AssertionResult gtest_ar_;
  Message local_c50;
  string local_c48;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar_3;
  Message local_c10;
  string local_c08;
  undefined1 local_be8 [8];
  AssertionResult gtest_ar_2;
  Message local_bd0;
  undefined1 local_bc8 [8];
  AssertionResult gtest_ar_1;
  Message local_bb0;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_ba8;
  Pubkey local_b90;
  AssertHelper local_b78;
  Message local_b70;
  string local_b68;
  AssertHelper local_b48;
  Message local_b40;
  DescriptorScriptReference local_b38;
  AssertHelper local_7d0;
  Message local_7c8 [2];
  Script local_7b8;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_5e8 [8];
  Pubkey pubkey;
  DescriptorScriptReference script_ref;
  string local_260 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  undefined1 local_90 [8];
  string descriptor2;
  undefined1 local_68 [8];
  string descriptor1;
  allocator local_31;
  string local_30 [8];
  string pubkey_hex;
  Descriptor_Parse_Privkey_Mainnet_Uncompress_Test *this_local;
  
  pubkey_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,"pkh(5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC)",
             (allocator *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,"wpkh(5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC)",
             (allocator *)&desc.root_node_.field_0x16f);
  std::allocator<char>::~allocator((allocator<char> *)&desc.root_node_.field_0x16f);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_260,"",
             (allocator *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_5e8);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_68,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kMainnet);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_7b8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_7b8);
      cfd::core::Script::~Script(&local_7b8);
    }
  }
  else {
    testing::Message::Message(local_7c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x28c,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_7d0,local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    testing::Message::~Message(local_7c8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_b38,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_b38);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_b38);
    }
  }
  else {
    testing::Message::Message(&local_b40);
    testing::internal::AssertHelper::AssertHelper
              (&local_b48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x28d,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b48,&local_b40);
    testing::internal::AssertHelper::~AssertHelper(&local_b48);
    testing::Message::~Message(&local_b40);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_b68,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_260,(string *)&local_b68);
      std::__cxx11::string::~string((string *)&local_b68);
    }
  }
  else {
    testing::Message::Message(&local_b70);
    testing::internal::AssertHelper::AssertHelper
              (&local_b78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x28e,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b78,&local_b70);
    testing::internal::AssertHelper::~AssertHelper(&local_b78);
    testing::Message::~Message(&local_b70);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_ba8,
                 (DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_00 = std::
                vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ::operator[](&local_ba8,0);
      cfd::core::DescriptorKeyReference::GetPubkey(&local_b90,this_00);
      cfd::core::Pubkey::operator=((Pubkey *)local_5e8,&local_b90);
      cfd::core::Pubkey::~Pubkey(&local_b90);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_ba8);
    }
  }
  else {
    testing::Message::Message(&local_bb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x28f,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_bb0);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_bc8,"desc_str.c_str()","descriptor1.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc8);
  if (!bVar1) {
    testing::Message::Message(&local_bd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x290,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
  cfd::core::Script::ToString_abi_cxx11_(&local_c08,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_be8,"locking_script.ToString().c_str()",
             "\"OP_DUP OP_HASH160 06399b0a8229214e0614afa119531b46e1d1f29b OP_EQUALVERIFY OP_CHECKSIG\""
             ,pcVar2,
             "OP_DUP OP_HASH160 06399b0a8229214e0614afa119531b46e1d1f29b OP_EQUALVERIFY OP_CHECKSIG"
            );
  std::__cxx11::string::~string((string *)&local_c08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_c10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_be8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x292,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_c48,(Pubkey *)local_5e8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c28,"pubkey.GetHex().c_str()","pubkey_hex.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_c48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c28);
  if (!bVar1) {
    testing::Message::Message(&local_c50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x294,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_c50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_c50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
  bVar1 = cfd::core::Pubkey::IsCompress((Pubkey *)local_5e8);
  local_c69 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c68,&local_c69,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c68);
  if (!bVar1) {
    testing::Message::Message(&local_c78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ca0,(internal *)local_c68,(AssertionResult *)"pubkey.IsCompress()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x295,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c80,&local_c78);
    testing::internal::AssertHelper::~AssertHelper(&local_c80);
    std::__cxx11::string::~string((string *)&local_ca0);
    testing::Message::~Message(&local_c78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c68);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&gtest_ar__1.message_,(string *)local_90,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kMainnet);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&gtest_ar__1.message_
            );
  cfd::core::Descriptor::~Descriptor((Descriptor *)&gtest_ar__1.message_);
  local_e21 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e20,&local_e21,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e20);
  if (!bVar1) {
    testing::Message::Message(&local_e30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&except_1,(internal *)local_e20,(AssertionResult *)0x6e96c0,"false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x299,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e38,&local_e30);
    testing::internal::AssertHelper::~AssertHelper(&local_e38);
    std::__cxx11::string::~string((string *)&except_1);
    testing::Message::~Message(&local_e30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e20);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_5e8);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_260);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_Privkey_Mainnet_Uncompress) {
  //   pubkey: '04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77',
  //   privkey: '5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC'
  std::string pubkey_hex = "04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77";
  std::string descriptor1 = "pkh(5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC)";
  std::string descriptor2 = "wpkh(5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  Pubkey pubkey;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "OP_DUP OP_HASH160 06399b0a8229214e0614afa119531b46e1d1f29b OP_EQUALVERIFY OP_CHECKSIG");
  EXPECT_STREQ(pubkey.GetHex().c_str(),
      pubkey_hex.c_str());
  EXPECT_FALSE(pubkey.IsCompress());

  try {
    desc = Descriptor::Parse(descriptor2);
    EXPECT_TRUE(false);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Failed to unsing uncompressed pubkey.", except.what());
  }
}